

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

void __thiscall gguf_writer::write<unsigned_long>(gguf_writer *this,unsigned_long *val)

{
  vector<signed_char,std::allocator<signed_char>> *this_00;
  iterator __position;
  size_t i;
  long lVar1;
  
  lVar1 = 0;
  do {
    this_00 = (vector<signed_char,std::allocator<signed_char>> *)this->buf;
    __position._M_current = *(char **)(this_00 + 8);
    if (__position._M_current == *(char **)(this_00 + 0x10)) {
      std::vector<signed_char,std::allocator<signed_char>>::_M_realloc_insert<signed_char_const&>
                (this_00,__position,(char *)((long)val + lVar1));
    }
    else {
      *__position._M_current = *(char *)((long)val + lVar1);
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void write(const T & val) const {
        for (size_t i = 0; i < sizeof(val); ++i) {
            buf.push_back(reinterpret_cast<const int8_t *>(&val)[i]);
        }
    }